

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>,_Eigen::internal::IndexBased,_double>
::unary_evaluator(unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
                  *this,XprType *replicate)

{
  _MatrixTypeNested *p_Var1;
  Index IVar2;
  XprType *replicate_local;
  unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
  *this_local;
  
  evaluator_base<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>
  ::evaluator_base((evaluator_base<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>
                    *)this);
  p_Var1 = Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>::
           nestedExpression(replicate);
  (this->m_arg).m_matrix = p_Var1->m_matrix;
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::evaluator
            (&this->m_argImpl,&this->m_arg);
  p_Var1 = Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>::
           nestedExpression(replicate);
  IVar2 = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::rows(p_Var1);
  variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x10,IVar2);
  p_Var1 = Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>::
           nestedExpression(replicate);
  IVar2 = Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::cols(p_Var1);
  variable_if_dynamic<long,_3>::variable_if_dynamic
            ((variable_if_dynamic<long,_3> *)&this->field_0x11,IVar2);
  return;
}

Assistant:

explicit unary_evaluator(const XprType& replicate)
    : m_arg(replicate.nestedExpression()),
      m_argImpl(m_arg),
      m_rows(replicate.nestedExpression().rows()),
      m_cols(replicate.nestedExpression().cols())
  {}